

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc32.cpp
# Opt level: O0

void __thiscall Crc32::GenerateTable(Crc32 *this,uint32_t polynomial,bool reflectIn,bool reflectOut)

{
  uint32_t uVar1;
  reference pvVar2;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_24;
  undefined4 local_20;
  int bit;
  uint32_t crc;
  int byte;
  bool reflectOut_local;
  bool reflectIn_local;
  uint32_t polynomial_local;
  Crc32 *this_local;
  
  for (bit = 0; bit < 0x100; bit = bit + 1) {
    if (reflectIn) {
      uVar1 = Reverse(this,bit);
      local_34 = uVar1 >> 0x18;
    }
    else {
      local_34 = bit;
    }
    local_20 = local_34;
    for (local_24 = 0x20; 0 < local_24; local_24 = local_24 + -1) {
      if ((local_20 & 0x80000000) == 0) {
        local_20 = local_20 << 1;
      }
      else {
        local_20 = local_20 << 1 ^ polynomial;
      }
    }
    if (reflectOut) {
      local_38 = Reverse(this,local_20);
    }
    else {
      local_38 = local_20;
    }
    pvVar2 = std::array<unsigned_int,_256UL>::operator[](&this->crcTable,(long)bit);
    *pvVar2 = local_38;
  }
  return;
}

Assistant:

void Crc32::GenerateTable(uint32_t polynomial, bool reflectIn, bool reflectOut)
{
  for (int byte = 0; byte < 256; ++byte)
  {
    uint32_t crc = (reflectIn ? (Reverse(uint32_t(byte)) >> 24) : byte);

    for (int bit = 32; bit > 0; --bit)
    {
      if (crc & 0x80000000)
      {
        crc = (crc << 1) ^ polynomial;
      }
      else
      {
        crc <<= 1;
      }
    }

    crcTable[byte] = (reflectOut ? Reverse(crc) : crc);
  }
}